

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O3

void alcSetError(ALCdevice *device,ALCenum errorCode)

{
  atomic<int> *paVar1;
  
  if (1 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Error generated on device %p, code 0x%04x\n",device,
            errorCode);
  }
  if ((anonymous_namespace)::TrapALCError == '\x01') {
    raise(5);
  }
  paVar1 = (atomic<int> *)&(anonymous_namespace)::LastNullDeviceError;
  if (device != (ALCdevice *)0x0) {
    paVar1 = &device->LastError;
  }
  LOCK();
  (paVar1->super___atomic_base<int>)._M_i = errorCode;
  UNLOCK();
  return;
}

Assistant:

static void alcSetError(ALCdevice *device, ALCenum errorCode)
{
    WARN("Error generated on device %p, code 0x%04x\n", decltype(std::declval<void*>()){device},
        errorCode);
    if(TrapALCError)
    {
#ifdef _WIN32
        /* DebugBreak() will cause an exception if there is no debugger */
        if(IsDebuggerPresent())
            DebugBreak();
#elif defined(SIGTRAP)
        raise(SIGTRAP);
#endif
    }

    if(device)
        device->LastError.store(errorCode);
    else
        LastNullDeviceError.store(errorCode);
}